

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest12::testImageDraw
          (FunctionalTest12 *this,GLuint subroutine_index,texture *left,texture *right,
          GLuint *expected_left_color,GLuint *expected_right_color)

{
  ostringstream *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  uint err;
  undefined4 extraout_var;
  FunctionalTest12 *this_01;
  GLuint subroutine_index_local;
  undefined1 local_1b0 [8];
  FunctionalTest12 local_1a8 [2];
  long lVar5;
  
  subroutine_index_local = subroutine_index;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar5 + 0x1668))(0x8b30,1,&subroutine_index_local);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x18a9);
  (**(code **)(lVar5 + 0x14f0))(this->m_left_image,0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Uniform1i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x18ad);
  (**(code **)(lVar5 + 0x14f0))(this->m_right_image,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Uniform1i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x18b0);
  (**(code **)(lVar5 + 0x80))(0,left->m_id,0,0,0,0x88ba,0x8d70);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"BindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x18b3);
  (**(code **)(lVar5 + 0x80))(1,right->m_id,0,0,0,0x88ba,0x8d70);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"BindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x18b6);
  (**(code **)(lVar5 + 0x538))(0,0,1);
  err = (**(code **)(lVar5 + 0x800))();
  this_01 = (FunctionalTest12 *)(ulong)err;
  glu::checkError(err,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x18ba);
  bVar1 = verifyTexture(this_01,left,expected_left_color);
  if (!bVar1) {
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_01 = (FunctionalTest12 *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
    std::operator<<((ostream *)this_01,
                    "Error. Invalid result. Left texture is filled with wrong color.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
  }
  bVar2 = verifyTexture(this_01,right,expected_right_color);
  if (!bVar2) {
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,
                    "Error. Invalid result. Right texture is filled with wrong color.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool FunctionalTest12::testImageDraw(GLuint subroutine_index, Utils::texture& left, Utils::texture& right,
									 const GLuint expected_left_color[4], const GLuint expected_right_color[4]) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set subroutine uniforms */
	gl.uniformSubroutinesuiv(GL_FRAGMENT_SHADER, 1, &subroutine_index);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Set up image units */
	gl.uniform1i(m_left_image, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

	gl.uniform1i(m_right_image, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

	gl.bindImageTexture(0, left.m_id, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32UI);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");

	gl.bindImageTexture(1, right.m_id, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32UI);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");

	/* Draw */
	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	/* Verify results */
	bool result = true;

	if (false == verifyTexture(left, expected_left_color))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Error. Invalid result. Left texture is filled with wrong color."
											<< tcu::TestLog::EndMessage;
		result = false;
	}

	if (false == verifyTexture(right, expected_right_color))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Error. Invalid result. Right texture is filled with wrong color."
											<< tcu::TestLog::EndMessage;
		result = false;
	}

	/* Done */
	return result;
}